

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,ParseableFunctionInfo *proxy)

{
  Type *addr;
  Type *addr_00;
  byte bVar1;
  Type pSVar2;
  Utf8SourceInfo *pUVar3;
  FunctionInfo *pFVar4;
  NestedArray *pNVar5;
  code *pcVar6;
  undefined8 address;
  bool bVar7;
  BOOL BVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  Recycler *this_00;
  undefined4 *puVar12;
  uint *puVar13;
  undefined4 extraout_var;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  Type TVar19;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  pSVar2 = (proxy->super_FunctionProxy).m_scriptContext;
  pUVar3 = (proxy->super_FunctionProxy).m_utf8SourceInfo.ptr;
  TVar19 = (proxy->super_FunctionProxy).m_functionNumber;
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014ef888;
  (this->super_FunctionProxy).auxPtrs.ptr =
       (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0;
  (this->super_FunctionProxy).functionInfo.ptr = (FunctionInfo *)0x0;
  (this->super_FunctionProxy).m_scriptContext = pSVar2;
  addr = &(this->super_FunctionProxy).m_utf8SourceInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_FunctionProxy).m_utf8SourceInfo.ptr = pUVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = (ProxyEntryPointInfo *)0x0;
  (this->super_FunctionProxy).deferredPrototypeType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).undeferredFunctionType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).m_functionNumber = TVar19;
  TVar19 = 0;
  bVar1 = (this->super_FunctionProxy).field_0x47;
  (this->super_FunctionProxy).field_0x44 = ((this->super_FunctionProxy).field_0x44 & 0xd0) + 1;
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014efa38;
  uVar16 = (*(ushort *)&(this->super_FunctionProxy).field_0x45 & 0xfffc) + 1;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar16;
  uVar17 = *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x10;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar16 & 0xffed | uVar17;
  uVar18 = *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x20;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 = uVar16 & 0xffcd | uVar17 | uVar18;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       uVar16 & 0xff8d | uVar17 | uVar18 |
       *(ushort *)&(proxy->super_FunctionProxy).field_0x45 & 0x40;
  bVar14 = (proxy->super_FunctionProxy).field_0x47 & 0x10;
  (this->super_FunctionProxy).field_0x47 = bVar1 & 0xef | bVar14;
  bVar15 = (proxy->super_FunctionProxy).field_0x47 & 0x20;
  (this->super_FunctionProxy).field_0x47 = bVar1 & 0xcf | bVar14 | bVar15;
  (this->super_FunctionProxy).field_0x47 =
       bVar1 & 0x8f | bVar14 | bVar15 | (proxy->super_FunctionProxy).field_0x47 & 0x40;
  this->m_reportedInParamCount = proxy->m_reportedInParamCount;
  (this->m_displayName).ptr = (char16_t *)0x0;
  (this->nestedArray).ptr = (NestedArray *)0x0;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  (this->crossSiteDeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  (this->crossSiteUndeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  pFVar4 = (proxy->super_FunctionProxy).functionInfo.ptr;
  addr_00 = &(this->super_FunctionProxy).functionInfo;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->super_FunctionProxy).functionInfo.ptr = pFVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  pNVar5 = (proxy->nestedArray).ptr;
  if (pNVar5 != (NestedArray *)0x0) {
    TVar19 = pNVar5->nestedCount;
  }
  if (TVar19 == 0) {
    (this->nestedArray).ptr = (NestedArray *)0x0;
  }
  else {
    local_68 = (undefined1  [8])&NestedArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x6c2;
    data.typeinfo = (type_info *)((ulong)TVar19 * 8);
    data._32_8_ = &this->nestedArray;
    this_00 = Memory::Recycler::TrackAllocInfo
                        (((this->super_FunctionProxy).m_scriptContext)->recycler,
                         (TrackAllocData *)local_68);
    BVar8 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar8 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar7) goto LAB_007668bf;
      *puVar12 = 0;
    }
    puVar13 = (uint *)Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                                (this_00,(size_t)((type_info *)((ulong)TVar19 * 8) + 8));
    if (puVar13 == (uint *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar7) {
LAB_007668bf:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar12 = 0;
    }
    address = data._32_8_;
    *puVar13 = TVar19;
    Memory::Recycler::WBSetBit((char *)data._32_8_);
    *(uint **)address = puVar13;
    Memory::RecyclerWriteBarrierManager::WriteBarrier((void *)address);
  }
  Copy(proxy,this);
  iVar9 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(proxy);
  uVar10 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[8])(proxy);
  uVar11 = (*(proxy->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
             _vptr_IRecyclerVisitedObject[9])(proxy);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,CONCAT44(extraout_var,iVar9),(ulong)uVar10,(ulong)uVar11,0);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(ParseableFunctionInfo * proxy) :
      FunctionProxy(proxy->GetScriptContext(), proxy->GetUtf8SourceInfo(), proxy->GetFunctionNumber()),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      m_hasBeenParsed(false),
      m_isNamedFunctionExpression(proxy->GetIsNamedFunctionExpression()),
      m_isNameIdentifierRef (proxy->GetIsNameIdentifierRef()),
      m_isStaticNameFunction(proxy->GetIsStaticNameFunction()),
      m_reportedInParamCount(proxy->GetReportedInParamsCount()),
      m_reparsed(proxy->IsReparsed()),
      m_isMethod(proxy->IsMethod()),
      m_tag21(true)
#if DBG
      , m_wasEverAsmjsMode(proxy->m_wasEverAsmjsMode)
#endif
    {
        FunctionInfo * functionInfo = proxy->GetFunctionInfo();
        this->functionInfo = functionInfo;

        uint nestedCount = proxy->GetNestedCount();
        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        proxy->Copy(this);

        SetDisplayName(proxy->GetDisplayName(), proxy->GetDisplayNameLength(), proxy->GetShortDisplayNameOffset());
    }